

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.cpp
# Opt level: O2

int zmq::get_peer_ip_address(fd_t sockfd_,string *ip_addr_)

{
  zmq_socklen_t __salen;
  int iVar1;
  int *piVar2;
  char *errmsg_;
  uint uVar3;
  sockaddr_storage ss;
  char host [1025];
  
  __salen = get_socket_address(sockfd_,socket_end_remote,&ss);
  if (__salen == 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (((iVar1 == 0x58) || (iVar1 == 9)) || (uVar3 = 0, iVar1 == 0xe)) {
      errmsg_ = strerror(iVar1);
      uVar3 = 0;
      fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip.cpp"
              ,0xb7);
      fflush(_stderr);
      zmq_abort(errmsg_);
    }
  }
  else {
    uVar3 = 0;
    iVar1 = getnameinfo((sockaddr *)&ss,__salen,host,0x401,(char *)0x0,0,1);
    if (iVar1 == 0) {
      std::__cxx11::string::assign((char *)ip_addr_);
      uVar3 = (uint)ss.ss_family;
    }
  }
  return uVar3;
}

Assistant:

int zmq::get_peer_ip_address (fd_t sockfd_, std::string &ip_addr_)
{
    struct sockaddr_storage ss;

    const zmq_socklen_t addrlen =
      get_socket_address (sockfd_, socket_end_remote, &ss);

    if (addrlen == 0) {
#ifdef ZMQ_HAVE_WINDOWS
        const int last_error = WSAGetLastError ();
        wsa_assert (last_error != WSANOTINITIALISED && last_error != WSAEFAULT
                    && last_error != WSAEINPROGRESS
                    && last_error != WSAENOTSOCK);
#elif !defined(TARGET_OS_IPHONE) || !TARGET_OS_IPHONE
        errno_assert (errno != EBADF && errno != EFAULT && errno != ENOTSOCK);
#else
        errno_assert (errno != EFAULT && errno != ENOTSOCK);
#endif
        return 0;
    }

    char host[NI_MAXHOST];
    const int rc =
      getnameinfo (reinterpret_cast<struct sockaddr *> (&ss), addrlen, host,
                   sizeof host, NULL, 0, NI_NUMERICHOST);
    if (rc != 0)
        return 0;

    ip_addr_ = host;

    union
    {
        struct sockaddr sa;
        struct sockaddr_storage sa_stor;
    } u;

    u.sa_stor = ss;
    return static_cast<int> (u.sa.sa_family);
}